

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::set_current_tabpage(Nvim *this,Tabpage tabpage)

{
  allocator local_39;
  string local_38;
  Tabpage local_18;
  Tabpage tabpage_local;
  Nvim *this_local;
  
  local_18 = tabpage;
  tabpage_local = (Tabpage)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_set_current_tabpage",&local_39);
  NvimRPC::call<long>(&this->client_,&local_38,(nullptr_t)0x0,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::set_current_tabpage(Tabpage tabpage) {
    client_.call("nvim_set_current_tabpage", nullptr, tabpage);
}